

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxyMono.cpp
# Opt level: O2

Clause * __thiscall Shell::EqualityProxyMono::apply(EqualityProxyMono *this,Clause *cl)

{
  Literal *lit;
  Literal *elem;
  TermList *pTVar1;
  Unit **ppUVar2;
  Literal **ppLVar3;
  Clause *pCVar4;
  List<Kernel::Unit_*> **in_RCX;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  ConstIterator it;
  UnitList *prems;
  RStack<Literal_*> resLits;
  undefined1 local_f0 [24];
  Stack<Kernel::Unit_*> local_d8;
  EqualityProxyMono *local_b0;
  NonspecificInference2 local_a8;
  Inference local_90;
  Inference local_60;
  
  local_d8._cursor = (Unit **)0x0;
  local_d8._end = (Unit **)0x0;
  local_d8._capacity = 0;
  local_d8._stack = (Unit **)0x0;
  local_b0 = this;
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
           (local_f0 + 8));
  uVar7 = *(uint *)&cl->field_0x38 & 0xfffff;
  uVar6 = (ulong)(uVar7 != 0);
  ppLVar3 = (Literal **)0x0;
  if (uVar7 != 0) {
    ppLVar3 = cl->_literals;
  }
  bVar8 = false;
  while (ppLVar3 != (Literal **)0x0) {
    lit = *ppLVar3;
    elem = apply(local_b0,lit);
    Lib::Stack<Kernel::Literal_*>::push((Stack<Kernel::Literal_*> *)local_f0._8_8_,elem);
    if (elem != lit) {
      pTVar1 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::get
                         (&s_proxyPredicateSorts,(elem->super_Term)._functor);
      ppUVar2 = Lib::DHMap<Kernel::TermList,_Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>::
                get(&s_proxyPremises,(TermList)pTVar1->_content);
      bVar8 = true;
      Lib::Stack<Kernel::Unit_*>::push(&local_d8,*ppUVar2);
    }
    uVar5 = (uint)uVar6;
    in_RCX = (List<Kernel::Unit_*> **)(ulong)(uVar5 < uVar7);
    ppLVar3 = cl->_literals + (int)uVar5;
    if (uVar7 <= uVar5) {
      ppLVar3 = (Literal **)0x0;
    }
    uVar6 = uVar6 + (long)in_RCX;
  }
  if (bVar8) {
    if ((long)local_d8._cursor - (long)local_d8._stack == 8) {
      local_a8.premise2 = *(Unit **)((long)local_d8._cursor + -8);
      local_a8.rule = EQUALITY_PROXY_REPLACEMENT;
      local_a8.premise1 = &cl->super_Unit;
      Kernel::Inference::Inference(&local_60,&local_a8);
      pCVar4 = Kernel::Clause::fromStack((Stack<Kernel::Literal_*> *)local_f0._8_8_,&local_60);
    }
    else {
      local_f0._0_8_ = (List<Kernel::Unit_*> *)0x0;
      it.super_ConstRefIterator._stack = (Stack<Kernel::Unit_*> *)local_f0;
      it.super_ConstRefIterator._pointer = (Unit **)&local_d8;
      Lib::List<Kernel::Unit*>::pushFromIterator<Lib::Stack<Kernel::Unit*>::ConstIterator>
                ((List<Kernel::Unit*> *)local_d8._cursor,it,in_RCX);
      local_f0._0_8_ =
           Lib::List<Kernel::Unit_*>::cons(&cl->super_Unit,(List<Kernel::Unit_*> *)local_f0._0_8_);
      local_a8.rule = EQUALITY_PROXY_REPLACEMENT;
      local_a8.premise1 = (Unit *)local_f0._0_8_;
      Kernel::Inference::Inference(&local_90,(NonspecificInferenceMany *)&local_a8);
      pCVar4 = Kernel::Clause::fromStack((Stack<Kernel::Literal_*> *)local_f0._8_8_,&local_90);
    }
    (pCVar4->super_Unit)._inference._age = (cl->super_Unit)._inference._age;
    cl = pCVar4;
  }
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
            (local_f0 + 8));
  Lib::Stack<Kernel::Unit_*>::~Stack(&local_d8);
  return cl;
}

Assistant:

Clause* EqualityProxyMono::apply(Clause* cl)
{
  UnitStack proxyPremises;
  RStack<Literal*> resLits;

  bool modified = false;
  for (Literal* lit : cl->iterLits()) {
    Literal* rlit=apply(lit);
    resLits->push(rlit);
    if (rlit != lit) {
      ASS(lit->isEquality());
      modified = true;
      TermList srt = s_proxyPredicateSorts.get(rlit->functor());
      Unit* prem = s_proxyPremises.get(srt);
      proxyPremises.push(prem);
    }
  }
  if (!modified) {
    return cl;
  }

  Clause* res;
  ASS(proxyPremises.isNonEmpty());
  if (proxyPremises.size() == 1) {
    res = Clause::fromStack(*resLits,
        NonspecificInference2(InferenceRule::EQUALITY_PROXY_REPLACEMENT, cl, proxyPremises.top()));
  }
  else {
    UnitList* prems = 0;
    UnitList::pushFromIterator(UnitStack::ConstIterator(proxyPremises),prems);
    UnitList::push(cl,prems);

    res = Clause::fromStack(*resLits,
        NonspecificInferenceMany(InferenceRule::EQUALITY_PROXY_REPLACEMENT, prems));
  }
  // TODO isn't this done atomatically
  res->setAge(cl->age()); // MS: this seems useless; as long as EqualityProxy is only operating as a part of preprocessing, age is going to 0 anyway

  return res;
}